

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O2

void movePack_free(MovePack *movePack,_Bool freeMoves)

{
  ulong uVar1;
  
  if (movePack != (MovePack *)0x0) {
    if (freeMoves) {
      for (uVar1 = 0; uVar1 < movePack->movesCount; uVar1 = uVar1 + 1) {
        move_free(movePack->moves[uVar1]);
      }
    }
    free(movePack->moves);
    free(movePack);
    return;
  }
  return;
}

Assistant:

void movePack_free(MovePack * movePack, bool freeMoves)
{
	unsigned long i;

	if(!movePack)
		return;

	if(freeMoves)
	{
		for(i=0;i<movePack->movesCount;i++)
		{
			move_free(movePack->moves[i]);
		}
	}
	
	free(movePack->moves);
	free(movePack);
}